

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O1

void soplex::setDualStatus<double>(Desc *desc,SPxSolverBase<double> *base,SPxId *id)

{
  int i;
  Status SVar1;
  long lVar2;
  DataKey local_30;
  
  if ((id->super_DataKey).info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_30,id);
    i = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                  (&(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set,&local_30);
    SVar1 = SPxBasisBase<double>::dualRowStatus(&base->super_SPxBasisBase<double>,i);
    lVar2 = 8;
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_30,id);
    i = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                  (&(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                    super_SVSetBase<double>.set,&local_30);
    SVar1 = SPxBasisBase<double>::dualColStatus(&base->super_SPxBasisBase<double>,i);
    lVar2 = 0x20;
  }
  *(Status *)(*(long *)((long)&(desc->rowstat).thesize + lVar2) + (long)i * 4) = SVar1;
  return;
}

Assistant:

static void setDualStatus(
   typename SPxBasisBase<R>::Desc& desc,
   const SPxSolverBase<R>& base,
   const SPxId& id)
{
   if(id.isSPxRowId())
   {
      int n = base.number(SPxRowId(id));
      desc.rowStatus(n) = base.basis().dualRowStatus(n);
   }
   else
   {
      int n = base.number(SPxColId(id));
      desc.colStatus(n) = base.basis().dualColStatus(n);
   }
}